

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O3

bool __thiscall
mocker::SymTbl::addSymbol
          (SymTbl *this,ScopeID *scopeID,string *identifier,
          shared_ptr<mocker::ast::Declaration> *decl)

{
  iterator iVar1;
  shared_ptr<mocker::SymTbl::Scope> scope;
  SymTbl local_28;
  
  getScope(&local_28,(ScopeID *)this);
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_28.root.
                    super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 identifier);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ast::Declaration>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ast::Declaration>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,std::shared_ptr<mocker::ast::Declaration>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ast::Declaration>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ast::Declaration>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_28.root.
                  super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               identifier,decl);
  }
  if (local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return iVar1.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
         ._M_cur == (__node_type *)0x0;
}

Assistant:

bool SymTbl::addSymbol(const ScopeID &scopeID, const std::string &identifier,
                       std::shared_ptr<ast::Declaration> decl) {
  auto scope = getScope(scopeID);
  if (scope->syms.find(identifier) != scope->syms.end())
    return false;
  scope->syms.emplace(identifier, std::move(decl));
  return true;
}